

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::FindUsedVertices(FNodeBuilder *this,vertex_t *oldverts,int max)

{
  double *pdVar1;
  FLevel *pFVar2;
  int iVar3;
  int iVar4;
  int *__s;
  line_t *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 local_40 [2];
  
  uVar8 = 0xffffffffffffffff;
  if (-1 < max) {
    uVar8 = (long)max * 4;
  }
  __s = (int *)operator_new__(uVar8);
  memset(__s,0xff,(long)max * 4);
  if (0 < this->Level->NumLines) {
    plVar5 = this->Level->Lines;
    lVar10 = 8;
    lVar7 = 0;
    do {
      lVar11 = *(long *)((long)plVar5->args + lVar10 + -0x2c);
      lVar6 = *(long *)((long)plVar5->args + lVar10 + -0x34) - (long)oldverts;
      lVar9 = (lVar6 >> 1) * 0x6db6db6db6db6db7;
      iVar3 = *(int *)((long)__s + lVar9);
      if (iVar3 == -1) {
        pdVar1 = (double *)((long)oldverts + lVar6);
        local_40[0] = CONCAT44(SUB84(pdVar1[1] + 103079215104.0,0),SUB84(*pdVar1 + 103079215104.0,0)
                              );
        iVar3 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
        *(int *)((long)__s + lVar9) = iVar3;
      }
      lVar11 = lVar11 - (long)oldverts;
      lVar6 = (lVar11 >> 1) * 0x6db6db6db6db6db7;
      iVar4 = *(int *)((long)__s + lVar6);
      if (iVar4 == -1) {
        pdVar1 = (double *)((long)oldverts + lVar11);
        local_40[0] = CONCAT44(SUB84(pdVar1[1] + 103079215104.0,0),SUB84(*pdVar1 + 103079215104.0,0)
                              );
        iVar4 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
        *(int *)((long)__s + lVar6) = iVar4;
        iVar3 = *(int *)((long)__s + lVar9);
      }
      pFVar2 = this->Level;
      plVar5 = pFVar2->Lines;
      *(long *)((long)plVar5->args + lVar10 + -0x34) = (long)iVar3;
      *(long *)((long)plVar5->args + lVar10 + -0x2c) = (long)iVar4;
      lVar7 = lVar7 + 1;
      lVar10 = lVar10 + 0x98;
    } while (lVar7 < pFVar2->NumLines);
  }
  this->OldVertexTable = __s;
  return;
}

Assistant:

void FNodeBuilder::FindUsedVertices (vertex_t *oldverts, int max)
{
	int *map = new int[max];
	int i;
	FPrivVert newvert;

	memset (&map[0], -1, sizeof(int)*max);

	for (i = 0; i < Level.NumLines; ++i)
	{
		ptrdiff_t v1 = Level.Lines[i].v1 - oldverts;
		ptrdiff_t v2 = Level.Lines[i].v2 - oldverts;

		if (map[v1] == -1)
		{
			newvert.x = oldverts[v1].fixX();
			newvert.y = oldverts[v1].fixY();
			map[v1] = VertexMap->SelectVertexExact (newvert);
		}
		if (map[v2] == -1)
		{
			newvert.x = oldverts[v2].fixX();
			newvert.y = oldverts[v2].fixY();
			map[v2] = VertexMap->SelectVertexExact (newvert);
		}

		Level.Lines[i].v1 = (vertex_t *)(size_t)map[v1];
		Level.Lines[i].v2 = (vertex_t *)(size_t)map[v2];
	}
	OldVertexTable = map;
}